

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file_format.cc
# Opt level: O0

InputGraph read_file_format(string *format,string *filename)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  bool bVar11;
  int iVar12;
  GraphFileError *this;
  undefined8 uVar13;
  char *pcVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_> in_RDI;
  string *in_stack_00000008;
  string *in_stack_00000010;
  istream *in_stack_00000018;
  string actual_format;
  ifstream infile;
  string *in_stack_00000290;
  ifstream *in_stack_00000298;
  char *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  ifstream *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  uint uVar15;
  size_type in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  byte in_stack_fffffffffffffc97;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  GraphFileError *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcc0;
  _Head_base<0UL,_InputGraph::Imp_*,_false> infile_00;
  char local_2b9 [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [2];
  undefined1 local_252;
  long local_220 [28];
  string *in_stack_fffffffffffffec0;
  ifstream *in_stack_fffffffffffffec8;
  
  infile_00._M_head_impl =
       (Imp *)in_RDI._M_t.
              super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
              super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
              super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
  std::ifstream::ifstream(local_220,(string *)in_RDX,_S_in);
  bVar1 = std::ios::operator!((void *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    local_252 = 1;
    this = (GraphFileError *)__cxa_allocate_exception(0x30);
    uVar2 = (undefined1)((ulong)in_stack_fffffffffffffc98 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (char *)in_stack_fffffffffffffc88,(allocator<char> *)in_stack_fffffffffffffc80);
    GraphFileError::GraphFileError
              (this,(string *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
               in_stack_fffffffffffffca0,(bool)uVar2);
    local_252 = 0;
    __cxa_throw(this,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),in_stack_fffffffffffffc88
            );
  uVar2 = std::operator==(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  if ((bool)uVar2) {
    detect_format(in_stack_00000298,in_stack_00000290);
    in_stack_fffffffffffffca0 = local_298;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    std::__cxx11::string::~string(in_stack_fffffffffffffc50);
    std::ios::clear((int)local_220 + (int)*(undefined8 *)(local_220[0] + -0x18));
    in_stack_fffffffffffffc98 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::istream::seekg((long)local_220,_S_beg);
    in_stack_fffffffffffffc97 =
         std::ios::operator!((void *)((long)&(in_stack_fffffffffffffc98->_M_dataplus)._M_p +
                                     *(long *)((in_stack_fffffffffffffc98->_M_dataplus)._M_p + -0x18
                                              )));
    if ((in_stack_fffffffffffffc97 & 1) != 0) {
      uVar13 = __cxa_allocate_exception(0x30);
      uVar3 = (undefined1)((ulong)in_stack_fffffffffffffc98 >> 0x38);
      pcVar14 = local_2b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),pcVar14,
                 (allocator<char> *)in_RDX);
      GraphFileError::GraphFileError
                (in_stack_fffffffffffffcb0,(string *)CONCAT17(uVar2,in_stack_fffffffffffffca8),
                 in_stack_fffffffffffffca0,(bool)uVar3);
      __cxa_throw(uVar13,&GraphFileError::typeinfo,GraphFileError::~GraphFileError);
    }
  }
  uVar3 = std::operator==(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  if ((bool)uVar3) {
    read_dimacs(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  }
  else {
    uVar4 = std::operator==(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    if ((bool)uVar4) {
      read_lad(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    }
    else {
      uVar5 = std::operator==(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      if ((bool)uVar5) {
        read_directed_lad(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
      }
      else {
        uVar6 = std::operator==(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        if ((bool)uVar6) {
          read_labelled_lad(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
        }
        else {
          uVar7 = std::operator==(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          if ((bool)uVar7) {
            read_vertex_labelled_lad(in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
          }
          else {
            uVar8 = std::operator==(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
            if ((bool)uVar8) {
              read_csv((istream *)infile_00._M_head_impl,in_stack_fffffffffffffcc0);
            }
            else {
              uVar9 = std::operator==(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
              if ((bool)uVar9) {
                read_unlabelled_undirected_vfmcs
                          (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
              }
              else {
                uVar10 = std::operator==(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
                if ((bool)uVar10) {
                  read_vertex_labelled_undirected_vfmcs
                            (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
                }
                else {
                  bVar11 = std::operator==(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
                  uVar15 = CONCAT13(bVar11,(int3)in_stack_fffffffffffffc6c);
                  if (bVar11) {
                    read_vertex_labelled_directed_vfmcs
                              (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
                  }
                  else {
                    iVar12 = std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             compare(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                                     CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,CONCAT14(uVar6,
                                                  CONCAT13(uVar7,CONCAT12(uVar8,CONCAT11(uVar9,
                                                  uVar10))))))),
                                     (char *)CONCAT44(uVar15,in_stack_fffffffffffffc68));
                    if (iVar12 != 0) {
                      pcVar14 = (char *)__cxa_allocate_exception(0x30);
                      std::operator+((char *)in_stack_fffffffffffffc98,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90
                                                ));
                      uVar3 = (undefined1)((ulong)in_stack_fffffffffffffc98 >> 0x38);
                      std::operator+(in_RDX,pcVar14);
                      GraphFileError::GraphFileError
                                (in_stack_fffffffffffffcb0,
                                 (string *)CONCAT17(uVar2,in_stack_fffffffffffffca8),
                                 in_stack_fffffffffffffca0,(bool)uVar3);
                      __cxa_throw(pcVar14,&GraphFileError::typeinfo,GraphFileError::~GraphFileError)
                      ;
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((ulong)uVar15 << 0x20),(size_type)in_RDX,
                             (size_type)in_stack_fffffffffffffc58);
                    read_csv_name(in_stack_00000018,in_stack_00000010,in_stack_00000008);
                    std::__cxx11::string::~string(in_stack_fffffffffffffc50);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffc50);
  std::ifstream::~ifstream(local_220);
  return (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
         (unique_ptr<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>)
         in_RDI._M_t.super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>.
         _M_t.super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
         super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl;
}

Assistant:

auto read_file_format(const string & format, const string & filename) -> InputGraph
{
    ifstream infile{filename};
    if (! infile)
        throw GraphFileError{filename, "unable to open file", false};

    auto actual_format = format;
    if (actual_format == "auto") {
        actual_format = detect_format(infile, filename);
        infile.clear();
        if (! infile.seekg(0, ios::beg))
            throw GraphFileError{filename, "unable to seek on input file (try specifying file format explicitly)", true};
    }

    if (actual_format == "dimacs")
        return read_dimacs(move(infile), filename);
    else if (actual_format == "lad")
        return read_lad(move(infile), filename);
    else if (actual_format == "directedlad")
        return read_directed_lad(move(infile), filename);
    else if (actual_format == "labelledlad")
        return read_labelled_lad(move(infile), filename);
    else if (actual_format == "vertexlabelledlad")
        return read_vertex_labelled_lad(move(infile), filename);
    else if (actual_format == "csv")
        return read_csv(move(infile), filename);
    else if (actual_format == "vfmcs")
        return read_unlabelled_undirected_vfmcs(move(infile), filename);
    else if (actual_format == "vfmcsv")
        return read_vertex_labelled_undirected_vfmcs(move(infile), filename);
    else if (actual_format == "vfmcsvd")
        return read_vertex_labelled_directed_vfmcs(move(infile), filename);
    else if (0 == actual_format.compare(0, 8, "csvname:"))
        return read_csv_name(move(infile), filename, actual_format.substr(8));
    else
        throw GraphFileError{filename, "Unknown file format '" + format + "'", true};
}